

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall sing::HttpResponse::reset(HttpResponse *this)

{
  undefined1 local_a0 [144];
  HttpResponse *local_10;
  HttpResponse *this_local;
  
  local_10 = this;
  unmapFile(this);
  memset(local_a0,0,0x90);
  memcpy(&this->mmFileStat,local_a0,0x90);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->headers);
  this->code = Unknown;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return;
}

Assistant:

void HttpResponse::reset(){
    unmapFile();
    mmFileStat = {0};
    headers.clear();
    code = Unknown;
    statusMessage.clear();
    body.clear();
    srcDir.clear();
    path.clear();
}